

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPCMapping.c
# Opt level: O1

_Bool PPC_abs_branch(cs_struct *h,uint id)

{
  long lVar1;
  bool bVar2;
  long lVar3;
  
  bVar2 = true;
  if (id != 0x72) {
    lVar3 = 0;
    do {
      bVar2 = lVar3 != 0x10;
      if (lVar3 == 0x10) {
        return bVar2;
      }
      lVar1 = lVar3 + 1;
      lVar3 = lVar3 + 1;
    } while (insn_abs[lVar1] != id);
  }
  return bVar2;
}

Assistant:

bool PPC_abs_branch(cs_struct *h, unsigned int id)
{
	int i;

	for (i = 0; insn_abs[i]; i++) {
		if (id == insn_abs[i]) {
			return true;
		}
	}

	// not found
	return false;
}